

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode cr_lc_add(Curl_easy *data)

{
  CURLcode local_1c;
  Curl_creader *pCStack_18;
  CURLcode result;
  Curl_creader *reader;
  Curl_easy *data_local;
  
  pCStack_18 = (Curl_creader *)0x0;
  reader = (Curl_creader *)data;
  local_1c = Curl_creader_create(&stack0xffffffffffffffe8,data,&cr_lc,CURL_CR_CONTENT_ENCODE);
  if (local_1c == CURLE_OK) {
    local_1c = Curl_creader_add((Curl_easy *)reader,pCStack_18);
  }
  if ((local_1c != CURLE_OK) && (pCStack_18 != (Curl_creader *)0x0)) {
    Curl_creader_free((Curl_easy *)reader,pCStack_18);
  }
  return local_1c;
}

Assistant:

static CURLcode cr_lc_add(struct Curl_easy *data)
{
  struct Curl_creader *reader = NULL;
  CURLcode result;

  result = Curl_creader_create(&reader, data, &cr_lc,
                               CURL_CR_CONTENT_ENCODE);
  if(!result)
    result = Curl_creader_add(data, reader);

  if(result && reader)
    Curl_creader_free(data, reader);
  return result;
}